

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

StringRef Catch::trim(StringRef ref)

{
  char cVar1;
  size_type sVar2;
  StringRef SVar3;
  bool local_51;
  bool local_41;
  ulong local_40;
  size_t real_end;
  size_t real_begin;
  undefined1 auStack_28 [7];
  anon_class_1_0_00000001 is_ws;
  StringRef ref_local;
  
  _auStack_28 = ref.m_start;
  real_begin._7_1_ = 0;
  real_end = 0;
  while( true ) {
    sVar2 = StringRef::size((StringRef *)auStack_28);
    local_41 = false;
    if (real_end < sVar2) {
      cVar1 = StringRef::operator[]((StringRef *)auStack_28,real_end);
      local_41 = trim::anon_class_1_0_00000001::operator()
                           ((anon_class_1_0_00000001 *)((long)&real_begin + 7),cVar1);
    }
    if (local_41 == false) break;
    real_end = real_end + 1;
  }
  local_40 = StringRef::size((StringRef *)auStack_28);
  while( true ) {
    local_51 = false;
    if (real_end < local_40) {
      cVar1 = StringRef::operator[]((StringRef *)auStack_28,local_40 - 1);
      local_51 = trim::anon_class_1_0_00000001::operator()
                           ((anon_class_1_0_00000001 *)((long)&real_begin + 7),cVar1);
    }
    if (local_51 == false) break;
    local_40 = local_40 - 1;
  }
  SVar3 = StringRef::substr((StringRef *)auStack_28,real_end,local_40 - real_end);
  return SVar3;
}

Assistant:

StringRef trim(StringRef ref) {
        const auto is_ws = [](char c) {
            return c == ' ' || c == '\t' || c == '\n' || c == '\r';
        };
        size_t real_begin = 0;
        while (real_begin < ref.size() && is_ws(ref[real_begin])) { ++real_begin; }
        size_t real_end = ref.size();
        while (real_end > real_begin && is_ws(ref[real_end - 1])) { --real_end; }

        return ref.substr(real_begin, real_end - real_begin);
    }